

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O0

IterateResult __thiscall deqp::UniformBlockCase::iterate(UniformBlockCase *this)

{
  allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *this_00;
  allocator<unsigned_char> *this_01;
  glUseProgramFunc p_Var1;
  glUniformBlockBindingFunc p_Var2;
  glBufferDataFunc p_Var3;
  glBindBufferRangeFunc p_Var4;
  GLuint GVar5;
  undefined4 uVar6;
  bool bVar7;
  int iVar8;
  deUint32 dVar9;
  GLenum GVar10;
  TestLog *log_00;
  RenderContext *pRVar11;
  undefined4 extraout_var;
  pointer pBVar12;
  size_type sVar13;
  reference pvVar14;
  mapped_type *ppvVar15;
  reference pvVar16;
  char *pcVar17;
  MessageBuilder *pMVar18;
  reference value;
  reference pvVar19;
  ContextInfo *pCVar20;
  mapped_type_conflict *pmVar21;
  long lVar22;
  GLuint GStack_b7c;
  bool renderOk;
  deUint32 binding_2;
  int blockNdx_7;
  deUint32 buffer_1;
  int blockNdx_6;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> glBlockPointers_1
  ;
  undefined1 local_b38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> glData_1;
  undefined1 local_b18 [4];
  int blockNdx_5;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> glBlockOffsets;
  int bindingAlignment;
  int numBlocks_1;
  int curOffset_1;
  int totalSize_1;
  deUint32 binding_1;
  deUint32 buffer;
  int blockNdx_4;
  int blockNdx_3;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> glBlockPointers;
  undefined1 local_a90 [8];
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  glData;
  undefined1 local_a70 [4];
  int numBlocks;
  UniformBufferManager bufferManager;
  deUint32 binding;
  int blockNdx_2;
  int local_8c8;
  allocator<char> local_8c1;
  int uniformNdx;
  allocator<char> local_899;
  string local_898;
  LogSection local_878;
  MessageBuilder local_838;
  int local_6b8;
  allocator<char> local_6b1;
  int blockNdx_1;
  allocator<char> local_689;
  string local_688;
  LogSection local_668;
  undefined1 local_628 [8];
  UniformLayout glLayout;
  string local_5f0 [32];
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8 [32];
  string local_588;
  ProgramSources local_568;
  undefined1 local_498 [8];
  ShaderProgram program;
  ostringstream fragSrc;
  ostringstream vtxSrc;
  int blockNdx;
  int curOffset;
  __normal_iterator<deqp::ub::BlockLayoutEntry_*,_std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>_>
  local_c8;
  __normal_iterator<deqp::ub::BlockLayoutEntry_*,_std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>_>
  local_c0;
  __normal_iterator<const_deqp::ub::BlockLayoutEntry_*,_std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>_>
  local_b8;
  const_iterator blockIter;
  int totalSize;
  undefined1 local_a0 [8];
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> blockPointers;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  UniformLayout refLayout;
  Functions *gl;
  TestLog *log;
  UniformBlockCase *this_local;
  Functions *gl_00;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pRVar11 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar8 = (*pRVar11->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar8);
  ub::UniformLayout::UniformLayout
            ((UniformLayout *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &blockPointers._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::map
            ((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             local_a0);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  ub::anon_unknown_1::computeStd140Layout
            ((UniformLayout *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&this->m_interface);
  blockIter._M_current._0_4_ = 0;
  local_c0._M_current =
       (BlockLayoutEntry *)
       std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::begin
                 ((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_> *
                  )&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  __gnu_cxx::
  __normal_iterator<deqp::ub::BlockLayoutEntry_const*,std::vector<deqp::ub::BlockLayoutEntry,std::allocator<deqp::ub::BlockLayoutEntry>>>
  ::__normal_iterator<deqp::ub::BlockLayoutEntry*>
            ((__normal_iterator<deqp::ub::BlockLayoutEntry_const*,std::vector<deqp::ub::BlockLayoutEntry,std::allocator<deqp::ub::BlockLayoutEntry>>>
              *)&local_b8,&local_c0);
  while( true ) {
    local_c8._M_current =
         (BlockLayoutEntry *)
         std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::end
                   ((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                     *)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar7 = __gnu_cxx::operator!=(&local_b8,&local_c8);
    if (!bVar7) break;
    pBVar12 = __gnu_cxx::
              __normal_iterator<const_deqp::ub::BlockLayoutEntry_*,_std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>_>
              ::operator->(&local_b8);
    blockIter._M_current._0_4_ = pBVar12->size + (int)blockIter._M_current;
    __gnu_cxx::
    __normal_iterator<const_deqp::ub::BlockLayoutEntry_*,_std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>_>
    ::operator++(&local_b8,0);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &blockPointers._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (long)(int)blockIter._M_current);
  vtxSrc._372_4_ = 0;
  for (vtxSrc._368_4_ = 0; uVar6 = vtxSrc._368_4_,
      sVar13 = std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
               ::size((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                       *)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage),
      (int)uVar6 < (int)sVar13; vtxSrc._368_4_ = vtxSrc._368_4_ + 1) {
    pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &blockPointers._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
    lVar22 = (long)(int)vtxSrc._372_4_;
    ppvVar15 = std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                             *)local_a0,(key_type_conflict *)&vtxSrc.field_0x170);
    *ppvVar15 = pvVar14 + lVar22;
    pvVar16 = std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::
              operator[]((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                          *)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (long)(int)vtxSrc._368_4_);
    vtxSrc._372_4_ = pvVar16->size + vtxSrc._372_4_;
  }
  ub::anon_unknown_1::generateValues
            ((UniformLayout *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             local_a0,1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fragSrc.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&program.m_program.m_info.linkTimeUs);
  ub::anon_unknown_1::generateVertexShader
            ((ostringstream *)&fragSrc.field_0x170,this->m_glslVersion,&this->m_interface,
             (UniformLayout *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             local_a0);
  ub::anon_unknown_1::generateFragmentShader
            ((ostringstream *)&program.m_program.m_info.linkTimeUs,this->m_glslVersion,
             &this->m_interface,
             (UniformLayout *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             local_a0);
  pRVar11 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  std::__cxx11::ostringstream::str();
  pcVar17 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,pcVar17,&local_5a9);
  std::__cxx11::ostringstream::str();
  pcVar17 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,pcVar17,
             (allocator<char> *)
             ((long)&glLayout.uniforms.
                     super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  glu::makeVtxFragSources(&local_568,&local_588,&local_5d0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_498,pRVar11,&local_568);
  glu::ProgramSources::~ProgramSources(&local_568);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&glLayout.uniforms.
                     super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string(local_5f0);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator(&local_5a9);
  std::__cxx11::string::~string(local_5a8);
  glu::operator<<(log_00,(ShaderProgram *)local_498);
  bVar7 = glu::ShaderProgram::isOk((ShaderProgram *)local_498);
  if (bVar7) {
    ub::UniformLayout::UniformLayout((UniformLayout *)local_628);
    dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_498);
    ub::anon_unknown_1::getGLUniformLayout(gl_00,(UniformLayout *)local_628,dVar9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_688,"ActiveUniformBlocks",&local_689);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&blockNdx_1,"Active Uniform Blocks",&local_6b1);
    tcu::LogSection::LogSection(&local_668,&local_688,(string *)&blockNdx_1);
    tcu::TestLog::operator<<(log_00,&local_668);
    tcu::LogSection::~LogSection(&local_668);
    std::__cxx11::string::~string((string *)&blockNdx_1);
    std::allocator<char>::~allocator(&local_6b1);
    std::__cxx11::string::~string((string *)&local_688);
    std::allocator<char>::~allocator(&local_689);
    for (local_6b8 = 0; iVar8 = local_6b8,
        sVar13 = std::
                 vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::
                 size((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                       *)local_628), iVar8 < (int)sVar13; local_6b8 = local_6b8 + 1) {
      tcu::TestLog::operator<<(&local_838,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar18 = tcu::MessageBuilder::operator<<(&local_838,&local_6b8);
      pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [3])0x2a0a8b4);
      pvVar16 = std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                ::operator[]((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                              *)local_628,(long)local_6b8);
      pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,pvVar16);
      tcu::MessageBuilder::operator<<(pMVar18,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_838);
    }
    tcu::TestLog::operator<<(log_00,(EndSectionToken *)&tcu::TestLog::EndSection);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_898,"ActiveUniforms",&local_899);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&uniformNdx,"Active Uniforms",&local_8c1);
    tcu::LogSection::LogSection(&local_878,&local_898,(string *)&uniformNdx);
    tcu::TestLog::operator<<(log_00,&local_878);
    tcu::LogSection::~LogSection(&local_878);
    std::__cxx11::string::~string((string *)&uniformNdx);
    std::allocator<char>::~allocator(&local_8c1);
    std::__cxx11::string::~string((string *)&local_898);
    std::allocator<char>::~allocator(&local_899);
    for (local_8c8 = 0; iVar8 = local_8c8,
        sVar13 = std::
                 vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                 ::size((vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                         *)&glLayout.blocks.
                            super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage), iVar8 < (int)sVar13
        ; local_8c8 = local_8c8 + 1) {
      tcu::TestLog::operator<<
                ((MessageBuilder *)&binding,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar18 = tcu::MessageBuilder::operator<<((MessageBuilder *)&binding,&local_8c8);
      pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,(char (*) [3])0x2a0a8b4);
      value = std::
              vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>::
              operator[]((vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                          *)&glLayout.blocks.
                             super__Vector_base<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_8c8);
      pMVar18 = tcu::MessageBuilder::operator<<(pMVar18,value);
      tcu::MessageBuilder::operator<<(pMVar18,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&binding);
    }
    tcu::TestLog::operator<<(log_00,(EndSectionToken *)&tcu::TestLog::EndSection);
    bVar7 = checkLayoutIndices(this,(UniformLayout *)local_628);
    if (((bVar7) && (bVar7 = checkLayoutBounds(this,(UniformLayout *)local_628), bVar7)) &&
       (bVar7 = compareTypes(this,(UniformLayout *)
                                  &data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (UniformLayout *)local_628), bVar7)) {
      bVar7 = compareStd140Blocks(this,(UniformLayout *)
                                       &data.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (UniformLayout *)local_628);
      if (!bVar7) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Invalid std140 layout");
      }
      bVar7 = compareSharedBlocks(this,(UniformLayout *)
                                       &data.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (UniformLayout *)local_628);
      if (!bVar7) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Invalid shared layout");
      }
      dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_498);
      bVar7 = checkIndexQueries(this,dVar9,(UniformLayout *)local_628);
      if (!bVar7) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Inconsintent block index query results");
      }
      p_Var1 = gl_00->useProgram;
      dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_498);
      (*p_Var1)(dVar9);
      for (bufferManager.m_buffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          GVar5 = bufferManager.m_buffers.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_,
          sVar13 = std::
                   vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::
                   size((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                         *)local_628), (int)GVar5 < (int)sVar13;
          bufferManager.m_buffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               bufferManager.m_buffers.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        bufferManager.m_buffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             bufferManager.m_buffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        p_Var2 = gl_00->uniformBlockBinding;
        dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_498);
        (*p_Var2)(dVar9,bufferManager.m_buffers.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_,
                  (GLuint)bufferManager.m_buffers.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      }
      GVar10 = (*gl_00->getError)();
      glu::checkError(GVar10,"Failed to set uniform block bindings",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                      ,0x5a2);
      pRVar11 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
      ub::UniformBufferManager::UniformBufferManager((UniformBufferManager *)local_a70,pRVar11);
      if (this->m_bufferMode == BUFFERMODE_PER_BLOCK) {
        sVar13 = std::
                 vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::
                 size((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                       *)local_628);
        glData.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar13;
        sVar13 = (size_type)
                 glData.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        this_00 = (allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                  ((long)&glBlockPointers._M_t._M_impl.super__Rb_tree_header._M_node_count + 7);
        std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::allocator
                  (this_00);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_a90,sVar13,this_00);
        std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~allocator
                  ((allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                   ((long)&glBlockPointers._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
        std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::map
                  ((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)&blockNdx_4);
        for (buffer = 0;
            (int)buffer <
            glData.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; buffer = buffer + 1) {
          pvVar19 = std::
                    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_a90,(long)(int)buffer);
          pvVar16 = std::
                    vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                    ::operator[]((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                  *)local_628,(long)(int)buffer);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (pvVar19,(long)pvVar16->size);
          pvVar19 = std::
                    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_a90,(long)(int)buffer);
          pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              (pvVar19,0);
          ppvVar15 = std::
                     map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                     ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                                   *)&blockNdx_4,(key_type_conflict *)&buffer);
          *ppvVar15 = pvVar14;
        }
        ub::anon_unknown_1::copyUniformData
                  ((UniformLayout *)local_628,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)&blockNdx_4,
                   (UniformLayout *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_a0);
        for (binding_1 = 0;
            (int)binding_1 <
            glData.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; binding_1 = binding_1 + 1) {
          dVar9 = ub::UniformBufferManager::allocBuffer((UniformBufferManager *)local_a70);
          (*gl_00->bindBuffer)(0x8a11,dVar9);
          p_Var3 = gl_00->bufferData;
          pvVar19 = std::
                    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_a90,(long)(int)binding_1);
          sVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar19);
          pvVar19 = std::
                    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_a90,(long)(int)binding_1);
          pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              (pvVar19,0);
          (*p_Var3)(0x8a11,sVar13,pvVar14,0x88e4);
          GVar10 = (*gl_00->getError)();
          glu::checkError(GVar10,"Failed to upload uniform buffer data",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                          ,0x5bc);
          (*gl_00->bindBufferBase)(0x8a11,binding_1,dVar9);
          GVar10 = (*gl_00->getError)();
          glu::checkError(GVar10,"glBindBufferBase(GL_UNIFORM_BUFFER) failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                          ,0x5bf);
        }
        std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::~map
                  ((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)&blockNdx_4);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)local_a90);
      }
      else {
        sVar13 = std::
                 vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::
                 size((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                       *)local_628);
        glBlockOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = (int)sVar13;
        pCVar20 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
        glBlockOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (*pCVar20->_vptr_ContextInfo[2])(pCVar20,0x8a34);
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                  ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   local_b18);
        bindingAlignment = 0;
        for (glData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            glData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ <
            glBlockOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
            glData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ =
                 glData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
          if (0 < (int)glBlockOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count) {
            bindingAlignment =
                 ub::anon_unknown_1::deRoundUp32
                           (bindingAlignment,
                            (int)glBlockOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          pmVar21 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_b18,
                                 (key_type_conflict *)
                                 ((long)&glData_1.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
          *pmVar21 = bindingAlignment;
          pvVar16 = std::
                    vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                    ::operator[]((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                  *)local_628,
                                 (long)glData_1.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          bindingAlignment = pvVar16->size + bindingAlignment;
        }
        this_01 = (allocator<unsigned_char> *)
                  ((long)&glBlockPointers_1._M_t._M_impl.super__Rb_tree_header._M_node_count + 7);
        std::allocator<unsigned_char>::allocator(this_01);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b38,
                   (long)bindingAlignment,this_01);
        std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)
                   ((long)&glBlockPointers_1._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
        std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::map
                  ((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)&buffer_1);
        for (blockNdx_7 = 0;
            blockNdx_7 < glBlockOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
            blockNdx_7 = blockNdx_7 + 1) {
          pmVar21 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_b18,&blockNdx_7);
          pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b38,
                               (long)*pmVar21);
          ppvVar15 = std::
                     map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                     ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                                   *)&buffer_1,&blockNdx_7);
          *ppvVar15 = pvVar14;
        }
        ub::anon_unknown_1::copyUniformData
                  ((UniformLayout *)local_628,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)&buffer_1,
                   (UniformLayout *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_a0);
        binding_2 = ub::UniformBufferManager::allocBuffer((UniformBufferManager *)local_a70);
        (*gl_00->bindBuffer)(0x8a11,binding_2);
        bVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b38);
        if (!bVar7) {
          p_Var3 = gl_00->bufferData;
          sVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b38);
          pvVar14 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b38,0)
          ;
          (*p_Var3)(0x8a11,sVar13,pvVar14,0x88e4);
        }
        GVar10 = (*gl_00->getError)();
        glu::checkError(GVar10,"Failed to upload uniform buffer data",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                        ,0x5e7);
        for (GStack_b7c = 0; dVar9 = binding_2, GVar5 = GStack_b7c,
            (int)GStack_b7c < glBlockOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
            GStack_b7c = GStack_b7c + 1) {
          p_Var4 = gl_00->bindBufferRange;
          pmVar21 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_b18,(key_type_conflict *)&stack0xfffffffffffff484);
          iVar8 = *pmVar21;
          pvVar16 = std::
                    vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                    ::operator[]((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                                  *)local_628,(long)(int)GStack_b7c);
          (*p_Var4)(0x8a11,GVar5,dVar9,(long)iVar8,(long)pvVar16->size);
          GVar10 = (*gl_00->getError)();
          glu::checkError(GVar10,"glBindBufferRange(GL_UNIFORM_BUFFER) failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcUniformBlockCase.cpp"
                          ,0x5f0);
          std::vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::
          operator[]((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                      *)local_628,(long)(int)GStack_b7c);
        }
        std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::~map
                  ((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)&buffer_1);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b38);
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                  ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   local_b18);
      }
      bVar7 = render(this,(ShaderProgram *)local_498);
      if (!bVar7) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Image compare failed");
      }
      glLayout.uniforms.
      super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      ub::UniformBufferManager::~UniformBufferManager((UniformBufferManager *)local_a70);
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Invalid layout");
      glLayout.uniforms.
      super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    ub::UniformLayout::~UniformLayout((UniformLayout *)local_628);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Compile failed");
    glLayout.uniforms.
    super__Vector_base<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_498);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&program.m_program.m_info.linkTimeUs)
  ;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fragSrc.field_0x170);
  std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::~map
            ((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             local_a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &blockPointers._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ub::UniformLayout::~UniformLayout
            ((UniformLayout *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return STOP;
}

Assistant:

UniformBlockCase::IterateResult UniformBlockCase::iterate(void)
{
	TestLog&			  log = m_testCtx.getLog();
	const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
	UniformLayout		  refLayout; //!< std140 layout.
	vector<deUint8>		  data;		 //!< Data.
	map<int, void*> blockPointers;   //!< Reference block pointers.

	// Initialize result to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Compute reference layout.
	computeStd140Layout(refLayout, m_interface);

	// Assign storage for reference values.
	{
		int totalSize = 0;
		for (vector<BlockLayoutEntry>::const_iterator blockIter = refLayout.blocks.begin();
			 blockIter != refLayout.blocks.end(); blockIter++)
			totalSize += blockIter->size;
		data.resize(totalSize);

		// Pointers for each block.
		int curOffset = 0;
		for (int blockNdx = 0; blockNdx < (int)refLayout.blocks.size(); blockNdx++)
		{
			blockPointers[blockNdx] = &data[0] + curOffset;
			curOffset += refLayout.blocks[blockNdx].size;
		}
	}

	// Generate values.
	generateValues(refLayout, blockPointers, 1 /* seed */);

	// Generate shaders and build program.
	std::ostringstream vtxSrc;
	std::ostringstream fragSrc;

	generateVertexShader(vtxSrc, m_glslVersion, m_interface, refLayout, blockPointers);
	generateFragmentShader(fragSrc, m_glslVersion, m_interface, refLayout, blockPointers);

	glu::ShaderProgram program(m_context.getRenderContext(),
							   glu::makeVtxFragSources(vtxSrc.str().c_str(), fragSrc.str().c_str()));
	log << program;

	if (!program.isOk())
	{
		// Compile failed.
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	// Query layout from GL.
	UniformLayout glLayout;
	getGLUniformLayout(gl, glLayout, program.getProgram());

	// Print layout to log.
	log << TestLog::Section("ActiveUniformBlocks", "Active Uniform Blocks");
	for (int blockNdx = 0; blockNdx < (int)glLayout.blocks.size(); blockNdx++)
		log << TestLog::Message << blockNdx << ": " << glLayout.blocks[blockNdx] << TestLog::EndMessage;
	log << TestLog::EndSection;

	log << TestLog::Section("ActiveUniforms", "Active Uniforms");
	for (int uniformNdx = 0; uniformNdx < (int)glLayout.uniforms.size(); uniformNdx++)
		log << TestLog::Message << uniformNdx << ": " << glLayout.uniforms[uniformNdx] << TestLog::EndMessage;
	log << TestLog::EndSection;

	// Check that we can even try rendering with given layout.
	if (!checkLayoutIndices(glLayout) || !checkLayoutBounds(glLayout) || !compareTypes(refLayout, glLayout))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid layout");
		return STOP; // It is not safe to use the given layout.
	}

	// Verify all std140 blocks.
	if (!compareStd140Blocks(refLayout, glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid std140 layout");

	// Verify all shared blocks - all uniforms should be active, and certain properties match.
	if (!compareSharedBlocks(refLayout, glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid shared layout");

	// Check consistency with index queries
	if (!checkIndexQueries(program.getProgram(), glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Inconsintent block index query results");

	// Use program.
	gl.useProgram(program.getProgram());

	// Assign binding points to all active uniform blocks.
	for (int blockNdx = 0; blockNdx < (int)glLayout.blocks.size(); blockNdx++)
	{
		deUint32 binding = (deUint32)blockNdx; // \todo [2012-01-25 pyry] Randomize order?
		gl.uniformBlockBinding(program.getProgram(), (deUint32)blockNdx, binding);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set uniform block bindings");

	// Allocate buffers, write data and bind to targets.
	UniformBufferManager bufferManager(m_context.getRenderContext());
	if (m_bufferMode == BUFFERMODE_PER_BLOCK)
	{
		int						 numBlocks = (int)glLayout.blocks.size();
		vector<vector<deUint8> > glData(numBlocks);
		map<int, void*> glBlockPointers;

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			glData[blockNdx].resize(glLayout.blocks[blockNdx].size);
			glBlockPointers[blockNdx] = &glData[blockNdx][0];
		}

		copyUniformData(glLayout, glBlockPointers, refLayout, blockPointers);

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			deUint32 buffer  = bufferManager.allocBuffer();
			deUint32 binding = (deUint32)blockNdx;

			gl.bindBuffer(GL_UNIFORM_BUFFER, buffer);
			gl.bufferData(GL_UNIFORM_BUFFER, (glw::GLsizeiptr)glData[blockNdx].size(), &glData[blockNdx][0],
						  GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to upload uniform buffer data");

			gl.bindBufferBase(GL_UNIFORM_BUFFER, binding, buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase(GL_UNIFORM_BUFFER) failed");
		}
	}
	else
	{
		DE_ASSERT(m_bufferMode == BUFFERMODE_SINGLE);

		int totalSize		 = 0;
		int curOffset		 = 0;
		int numBlocks		 = (int)glLayout.blocks.size();
		int bindingAlignment = m_context.getContextInfo().getInt(GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT);
		map<int, int> glBlockOffsets;

		// Compute total size and offsets.
		curOffset = 0;
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			if (bindingAlignment > 0)
				curOffset			 = deRoundUp32(curOffset, bindingAlignment);
			glBlockOffsets[blockNdx] = curOffset;
			curOffset += glLayout.blocks[blockNdx].size;
		}
		totalSize = curOffset;

		// Assign block pointers.
		vector<deUint8> glData(totalSize);
		map<int, void*> glBlockPointers;

		for (int blockNdx			  = 0; blockNdx < numBlocks; blockNdx++)
			glBlockPointers[blockNdx] = &glData[glBlockOffsets[blockNdx]];

		// Copy to gl format.
		copyUniformData(glLayout, glBlockPointers, refLayout, blockPointers);

		// Allocate buffer and upload data.
		deUint32 buffer = bufferManager.allocBuffer();
		gl.bindBuffer(GL_UNIFORM_BUFFER, buffer);
		if (!glData.empty())
			gl.bufferData(GL_UNIFORM_BUFFER, (glw::GLsizeiptr)glData.size(), &glData[0], GL_STATIC_DRAW);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to upload uniform buffer data");

		// Bind ranges to binding points.
		curOffset = 0;
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			deUint32 binding = (deUint32)blockNdx;
			gl.bindBufferRange(GL_UNIFORM_BUFFER, binding, buffer, (glw::GLintptr)glBlockOffsets[blockNdx],
							   (glw::GLsizeiptr)glLayout.blocks[blockNdx].size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange(GL_UNIFORM_BUFFER) failed");
			curOffset += glLayout.blocks[blockNdx].size;
		}
	}

	bool renderOk = render(program);
	if (!renderOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image compare failed");

	return STOP;
}